

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgProgramExecutor.cpp
# Opt level: O1

void rsg::interpolateVertexInput<64>
               (StridedValueAccess<64> dst,int dstComp,ConstValueRangeAccess valueRange,float x,
               float y)

{
  float fVar1;
  float fVar2;
  int iVar3;
  TestError *this;
  int iVar4;
  ulong uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  if ((valueRange.m_type)->m_baseType == TYPE_FLOAT) {
    iVar3 = (valueRange.m_type)->m_numElements;
    if (0 < (long)iVar3) {
      iVar4 = 0;
      uVar5 = 0;
      do {
        fVar6 = x;
        if ((uVar5 & 2) != 0) {
          fVar6 = 1.0 - x;
        }
        fVar7 = y;
        if ((uVar5 & 1) != 0) {
          fVar7 = 1.0 - y;
        }
        VariableType::getElementType(valueRange.m_type);
        fVar1 = valueRange.m_min[uVar5].floatVal;
        VariableType::getElementType(valueRange.m_type);
        fVar2 = valueRange.m_max[uVar5].floatVal;
        fVar8 = (fVar1 + fVar2) * 0.5;
        VariableType::getElementType(dst.super_ConstStridedValueAccess<64>.m_type);
        dst.super_ConstStridedValueAccess<64>.m_value[(long)dstComp + (long)iVar4].floatVal =
             fVar6 * fVar7 * fVar2 +
             fVar7 * (1.0 - fVar6) * fVar8 +
             (1.0 - fVar6) * (1.0 - fVar7) * fVar1 + (1.0 - fVar7) * fVar6 * fVar8;
        uVar5 = uVar5 + 1;
        iVar4 = iVar4 + 0x40;
      } while ((long)iVar3 != uVar5);
    }
    return;
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,(char *)0x0,"valueRange.getType().getBaseType() == VariableType::TYPE_FLOAT",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/randomshaders/rsgProgramExecutor.cpp"
             ,0x8c);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void interpolateVertexInput (StridedValueAccess<Stride> dst, int dstComp, const ConstValueRangeAccess valueRange, float x, float y)
{
	TCU_CHECK(valueRange.getType().getBaseType() == VariableType::TYPE_FLOAT);
	int numElements = valueRange.getType().getNumElements();
	for (int elementNdx = 0; elementNdx < numElements; elementNdx++)
	{
		float xd, yd;
		getVertexInterpolationCoords(xd, yd, x, y, elementNdx);
		dst.component(elementNdx).asFloat(dstComp) = interpolateVertex(valueRange.getMin().component(elementNdx).asFloat(), valueRange.getMax().component(elementNdx).asFloat(), xd, yd);
	}
}